

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void xcb_keyboard_handle_key(xcb_generic_event_t *event)

{
  uint8_t uVar1;
  char *pcVar2;
  xcb_generic_event_t *event_local;
  
  uVar1 = event->pad0;
  if (uVar1 == '\t') {
    sighandler(0xf);
  }
  else {
    if (uVar1 == '\x1c') {
      pcVar2 = getenv("NO_TEXTURE");
      if (pcVar2 == (char *)0x0) {
        setenv("NO_TEXTURE","1",1);
      }
      else {
        unsetenv("NO_TEXTURE");
      }
    }
    else {
      if (uVar1 == 'A') {
        animate = (int)((animate != 0 ^ 0xffU) & 1);
        redisplay = (int)(animate != 0);
        return;
      }
      if (uVar1 == 'o') {
        view_rx = view_rx + 5.0;
      }
      else if (uVar1 == 'p') {
        view_tz = view_tz + -5.0;
      }
      else if (uVar1 == 'q') {
        view_ry = view_ry + 5.0;
      }
      else if (uVar1 == 'r') {
        view_ry = view_ry - 5.0;
      }
      else if (uVar1 == 't') {
        view_rx = view_rx - 5.0;
      }
      else {
        if (uVar1 != 'u') {
          return;
        }
        view_tz = view_tz - -5.0;
      }
    }
    if (animate == 0) {
      redisplay = 1;
    }
  }
  return;
}

Assistant:

static void xcb_keyboard_handle_key(xcb_generic_event_t *event)
{
  switch (((xcb_key_press_event_t *)event)->detail) {
    case 0x09:
      sighandler(SIGTERM);
      return;
    case 0x41:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case 0x75:
      view_tz -= -5.0;
      break;
    case 0x70:
      view_tz += -5.0;
      break;
    case 0x74:
      view_rx -= 5.0;
      break;
    case 0x6f:
      view_rx += 5.0;
      break;
    case 0x72:
      view_ry -= 5.0;
      break;
    case 0x71:
      view_ry += 5.0;
      break;
    case 0x1c:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}